

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioaUtil.c
# Opt level: O3

char * Ioa_FileNameGenericAppend(char *pBase,char *pSuffix)

{
  byte bVar1;
  char *pcVar2;
  size_t sVar3;
  byte *pbVar4;
  char *pcVar5;
  
  if (pBase == (char *)0x0) {
    pcVar2 = strcpy(Ioa_FileNameGenericAppend::Buffer,pSuffix);
    return pcVar2;
  }
  pcVar5 = Ioa_FileNameGenericAppend::Buffer;
  strcpy(Ioa_FileNameGenericAppend::Buffer,pBase);
  pcVar2 = strrchr(Ioa_FileNameGenericAppend::Buffer,0x2e);
  if (pcVar2 != (char *)0x0) {
    *pcVar2 = '\0';
  }
  strcat(Ioa_FileNameGenericAppend::Buffer,pSuffix);
  sVar3 = strlen(Ioa_FileNameGenericAppend::Buffer);
  pbVar4 = &DAT_00e2681f + sVar3;
  if (&DAT_00e2681f < pbVar4) {
    do {
      bVar1 = *pbVar4;
      if ((((9 < (byte)(bVar1 - 0x30)) && (0x19 < (byte)((bVar1 & 0xdf) + 0xbf))) && (bVar1 != 0x5f)
          ) && (bVar1 != 0x2e)) {
        return (char *)(pbVar4 + 1);
      }
      pbVar4 = pbVar4 + -1;
    } while (&DAT_00e2681f < pbVar4);
  }
  else {
    pcVar5 = Ioa_FileNameGenericAppend::Buffer + sVar3;
  }
  return pcVar5;
}

Assistant:

char * Ioa_FileNameGenericAppend( char * pBase, char * pSuffix )
{
    static char Buffer[1000];
    char * pDot;
    if ( pBase == NULL )
    {
        strcpy( Buffer, pSuffix );
        return Buffer;
    }
    strcpy( Buffer, pBase );
    if ( (pDot = strrchr( Buffer, '.' )) )
        *pDot = 0;
    strcat( Buffer, pSuffix );
    // find the last occurrance of slash
    for ( pDot = Buffer + strlen(Buffer) - 1; pDot >= Buffer; pDot-- )    
        if (!((*pDot >= '0' && *pDot <= '9') ||
              (*pDot >= 'a' && *pDot <= 'z') ||
              (*pDot >= 'A' && *pDot <= 'Z') || 
               *pDot == '_' || *pDot == '.') )
               break;
    return pDot + 1;
}